

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssvectorbase.h
# Opt level: O0

void __thiscall soplex::SSVectorBase<double>::clear(SSVectorBase<double> *this)

{
  bool bVar1;
  reference pvVar2;
  SSVectorBase<double> *in_RDI;
  VectorBase<double> *unaff_retaddr;
  int i;
  int local_c;
  
  bVar1 = isSetup(in_RDI);
  if (bVar1) {
    for (local_c = 0; local_c < (in_RDI->super_IdxSet).num; local_c = local_c + 1) {
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&(in_RDI->super_VectorBase<double>).val,
                          (long)(in_RDI->super_IdxSet).idx[local_c]);
      *pvVar2 = 0.0;
    }
  }
  else {
    VectorBase<double>::clear(unaff_retaddr);
  }
  IdxSet::clear(&in_RDI->super_IdxSet);
  in_RDI->setupStatus = true;
  return;
}

Assistant:

void clear()
   {
      if(isSetup())
      {
         for(int i = 0; i < num; ++i)
            VectorBase<R>::val[idx[i]] = 0;
      }
      else
         VectorBase<R>::clear();

      IdxSet::clear();
      setupStatus = true;

      assert(isConsistent());
   }